

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_medium.c
# Opt level: O3

block_state deflate_medium(deflate_state *s,int flush)

{
  byte bVar1;
  int iVar2;
  short sVar3;
  Pos cur_match;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ushort uVar13;
  uchar *puVar14;
  uint uVar15;
  uint uVar16;
  uint32_t uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  ulong local_58;
  uint local_4c;
  ulong local_48;
  
  iVar2 = s->level;
  uVar18 = 0;
  local_58 = 0;
  local_48 = 0;
  uVar12 = 0;
LAB_0012f4a6:
  do {
    uVar8 = uVar12;
    if (s->lookahead < 0x106) {
      fill_window(s);
      uVar4 = s->lookahead;
      if (flush == 0 && uVar4 < 0x106) {
        return need_more;
      }
      uVar6 = s->strstart;
      if (uVar4 == 0) {
        uVar4 = 2;
        if (uVar6 < 2) {
          uVar4 = uVar6;
        }
        s->insert = uVar4;
        if (flush == 4) {
          iVar2 = s->block_start;
          if ((long)iVar2 < 0) {
            puVar14 = (uchar *)0x0;
          }
          else {
            puVar14 = s->window + iVar2;
          }
          zng_tr_flush_block(s,(char *)puVar14,uVar6 - iVar2,1);
          s->block_start = s->strstart;
          flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->sym_next != 0) {
          iVar2 = s->block_start;
          if ((long)iVar2 < 0) {
            puVar14 = (uchar *)0x0;
          }
          else {
            puVar14 = s->window + iVar2;
          }
          zng_tr_flush_block(s,(char *)puVar14,uVar6 - iVar2,0);
          s->block_start = s->strstart;
          flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
      if (uVar4 < 4) {
        uVar13 = 0;
      }
      else {
LAB_0012f51a:
        uVar13 = quick_insert_string(s,uVar6);
        uVar6 = s->strstart;
      }
      uVar8 = 1;
      if (((uVar13 == 0) || ((long)((ulong)uVar6 - (ulong)uVar13) < 1)) ||
         ((long)(ulong)(s->w_size - 0x106) < (long)((ulong)uVar6 - (ulong)uVar13))) {
        local_4c = 0;
      }
      else {
        uVar4 = longest_match_unaligned_16(s,uVar13);
        if ((uVar4 & 0xfffc) == 0) {
          uVar4 = 1;
        }
        uVar13 = (ushort)s->match_start;
        local_4c = (uint)uVar13;
        if (uVar13 < (ushort)uVar6) {
          uVar8 = (ulong)uVar4;
          uVar19 = (ulong)uVar6;
          goto LAB_0012f593;
        }
      }
      uVar19 = (ulong)uVar6;
    }
    else {
      if (iVar2 < 5) {
LAB_0012f510:
        uVar6 = s->strstart;
        goto LAB_0012f51a;
      }
      uVar6 = (uint)uVar18;
      local_4c = (uint)local_48;
      uVar19 = local_58;
      if ((short)uVar8 == 0) goto LAB_0012f510;
    }
LAB_0012f593:
    uVar22 = uVar8 & 0xffff;
    uVar4 = (uint)uVar22;
    if (uVar4 + 4 < s->lookahead) {
      uVar5 = (uint)uVar19 + 1;
      uVar9 = uVar4 - 1 & 0xffff;
      if (uVar9 < 3) {
        if ((uVar9 != 0) && ((ushort)uVar6 <= (ushort)uVar5)) {
          insert_string(s,uVar5 & 0xffff,uVar9);
        }
      }
      else {
        uVar10 = uVar5 & 0xffff;
        if ((ushort)uVar5 < (ushort)uVar6) {
          uVar6 = uVar6 & 0xffff;
          uVar5 = uVar9 + uVar10;
          uVar9 = uVar5 - uVar6;
          uVar10 = uVar6;
          if (uVar5 < uVar6 || uVar9 == 0) goto LAB_0012f5bc;
        }
        insert_string(s,uVar10,uVar9);
      }
    }
LAB_0012f5bc:
    uVar6 = (uint)uVar19 & 0xffff;
    if (((iVar2 < 5) || (s->lookahead < 0x107)) ||
       (uVar9 = uVar4 + uVar6, s->window_size - 0x106 <= uVar9)) {
      uVar12 = 0;
    }
    else {
      s->strstart = uVar9;
      cur_match = quick_insert_string(s,uVar9);
      uVar5 = s->strstart;
      uVar18 = (ulong)uVar5;
      local_48 = 0;
      uVar12 = 1;
      local_58 = uVar18;
      if (((cur_match != 0) && (0 < (long)(uVar18 - cur_match))) &&
         ((long)(uVar18 - cur_match) <= (long)(ulong)(s->w_size - 0x106))) {
        uVar9 = longest_match_unaligned_16(s,cur_match);
        uVar10 = s->match_start;
        local_48 = (ulong)uVar10;
        uVar7 = local_48 & 0xffff;
        uVar11 = uVar18 & 0xffff;
        uVar16 = (uint)uVar11;
        if (((uint)uVar7 < uVar16) && (3 < (ushort)uVar9)) {
          if ((1 < (ushort)uVar8) &&
             ((uVar4 <= (uint)uVar7 + 1 &&
              (puVar14 = s->window, puVar14[(uVar7 + 1) - uVar22] == puVar14[(uVar11 + 1) - uVar22])
              ))) {
            uVar4 = s->w_size - 0x106;
            uVar15 = uVar5 - uVar4 & 0xffff;
            if (uVar16 <= uVar4) {
              uVar15 = 0;
            }
            local_48._0_2_ = (ushort)uVar10;
            if ((((1 < (ushort)local_48) && (puVar14[uVar7 - 1] == puVar14[uVar11 - 1])) &&
                (uVar15 < uVar16)) && ((uVar9 & 0xffff) < 0x100)) {
              puVar14 = puVar14 + -2;
              uVar17 = uVar9;
              iVar20 = 0;
              while( true ) {
                uVar16 = uVar16 - 1;
                uVar12 = (ulong)(uVar17 + 1);
                iVar21 = iVar20 + -1;
                if ((puVar14[uVar7] != puVar14[uVar11]) ||
                   (sVar3 = (short)iVar20, (ushort)(sVar3 + (ushort)uVar8) == 1)) break;
                if ((uVar16 <= uVar15) ||
                   ((0xfe < (uVar17 & 0xffff) ||
                    (puVar14 = puVar14 + -1, uVar17 = uVar17 + 1, iVar20 = iVar21,
                    (ushort)((sVar3 + (ushort)local_48) - 1) < 2)))) break;
              }
              uVar4 = (int)uVar8 + iVar21;
              if (((ushort)uVar4 < 2) && ((ushort)((ushort)uVar9 - 2) != (short)iVar21)) {
                uVar18 = (ulong)(uVar5 + 1);
                uVar8 = (ulong)uVar4;
                local_58 = (ulong)(iVar21 + uVar5);
                local_48 = (ulong)(uVar10 + iVar21);
                goto LAB_0012f6ac;
              }
            }
          }
          uVar12 = (ulong)uVar9;
        }
      }
LAB_0012f6ac:
      s->strstart = uVar6;
    }
    uVar4 = (uint)uVar8;
    if ((ushort)uVar8 < 4) {
      if ((ushort)uVar8 == 0) goto LAB_0012f4a6;
      uVar5 = s->sym_next;
      uVar6 = 0;
      do {
        bVar1 = s->window[uVar19 & 0xffff];
        s->d_buf[uVar5] = 0;
        s->sym_next = uVar5 + 1;
        s->l_buf[uVar5] = bVar1;
        s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
        uVar5 = s->sym_next;
        s->lookahead = s->lookahead - 1;
        uVar6 = uVar6 + (uVar5 == s->sym_end);
        uVar19 = (ulong)((int)uVar19 + 1);
        uVar13 = (short)uVar8 - 1;
        uVar8 = (ulong)uVar13;
      } while (uVar13 != 0);
    }
    else {
      uVar10 = uVar4 & 0xffff;
      iVar20 = uVar6 - (local_4c & 0xffff);
      uVar5 = uVar10 - 3;
      uVar6 = s->sym_next;
      s->d_buf[uVar6] = (uint16_t)iVar20;
      s->sym_next = uVar6 + 1;
      s->l_buf[uVar6] = (uchar)uVar5;
      s->matches = s->matches + 1;
      s->dyn_ltree[(ulong)""[uVar5] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[uVar5] + 0x101].fc.freq + 1;
      uVar5 = iVar20 - 1;
      uVar6 = (uVar5 >> 7) + 0x100;
      if (uVar5 < 0x100) {
        uVar6 = uVar5;
      }
      s->dyn_dtree[""[uVar6]].fc.freq = s->dyn_dtree[""[uVar6]].fc.freq + 1;
      uVar6 = (uint)(s->sym_next == s->sym_end);
      s->lookahead = s->lookahead - uVar10;
    }
    uVar4 = (uVar4 & 0xffff) + s->strstart;
    s->strstart = uVar4;
    if (uVar6 != 0) {
      iVar20 = s->block_start;
      if ((long)iVar20 < 0) {
        puVar14 = (uchar *)0x0;
      }
      else {
        puVar14 = s->window + iVar20;
      }
      zng_tr_flush_block(s,(char *)puVar14,uVar4 - iVar20,0);
      s->block_start = s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_medium(deflate_state *s, int flush) {
    /* Align the first struct to start on a new cacheline, this allows us to fit both structs in one cacheline */
    ALIGNED_(16) struct match current_match;
                 struct match next_match;

    /* For levels below 5, don't check the next position for a better match */
    int early_exit = s->level < 5;

    memset(&current_match, 0, sizeof(struct match));
    memset(&next_match, 0, sizeof(struct match));

    for (;;) {
        Pos hash_head = 0;    /* head of the hash chain */
        int bflush = 0;       /* set if current block must be flushed */
        int64_t dist;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next current_match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
            next_match.match_length = 0;
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */

        /* If we already have a future match from a previous round, just use that */
        if (!early_exit && next_match.match_length > 0) {
            current_match = next_match;
            next_match.match_length = 0;
        } else {
            hash_head = 0;
            if (s->lookahead >= WANT_MIN_MATCH) {
                hash_head = quick_insert_string(s, s->strstart);
            }

            current_match.strstart = (uint16_t)s->strstart;
            current_match.orgstart = current_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                current_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                current_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(current_match.match_length < WANT_MIN_MATCH))
                    current_match.match_length = 1;
                if (UNLIKELY(current_match.match_start >= current_match.strstart)) {
                    /* this can happen due to some restarts */
                    current_match.match_length = 1;
                }
            } else {
                /* Set up the match to be a 1 byte literal */
                current_match.match_start = 0;
                current_match.match_length = 1;
            }
        }

        insert_match(s, current_match);

        /* now, look ahead one */
        if (LIKELY(!early_exit && s->lookahead > MIN_LOOKAHEAD && (uint32_t)(current_match.strstart + current_match.match_length) < (s->window_size - MIN_LOOKAHEAD))) {
            s->strstart = current_match.strstart + current_match.match_length;
            hash_head = quick_insert_string(s, s->strstart);

            next_match.strstart = (uint16_t)s->strstart;
            next_match.orgstart = next_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                next_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                next_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(next_match.match_start >= next_match.strstart)) {
                    /* this can happen due to some restarts */
                    next_match.match_length = 1;
                }
                if (next_match.match_length < WANT_MIN_MATCH)
                    next_match.match_length = 1;
                else
                    fizzle_matches(s, &current_match, &next_match);
            } else {
                /* Set up the match to be a 1 byte literal */
                next_match.match_start = 0;
                next_match.match_length = 1;
            }

            s->strstart = current_match.strstart;
        } else {
            next_match.match_length = 0;
        }

        /* now emit the current match */
        bflush = emit_match(s, current_match);

        /* move the "cursor" forward */
        s->strstart += current_match.match_length;

        if (UNLIKELY(bflush))
            FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);

    return block_done;
}